

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

void __thiscall
cmConditionEvaluator::HandlePredicate
          (cmConditionEvaluator *this,bool value,int *reducible,iterator *arg,
          cmArgumentList *newArgs,iterator *argP1,iterator *argP2)

{
  iterator *this_00;
  reference pcVar1;
  const_iterator local_f0;
  allocator local_e1;
  string local_e0;
  cmExpandedCommandArgument local_c0;
  allocator local_81;
  string local_80;
  cmExpandedCommandArgument local_60;
  iterator *local_38;
  iterator *argP1_local;
  cmArgumentList *newArgs_local;
  iterator *arg_local;
  int *reducible_local;
  cmConditionEvaluator *pcStack_10;
  bool value_local;
  cmConditionEvaluator *this_local;
  
  local_38 = argP1;
  argP1_local = (iterator *)newArgs;
  newArgs_local = (cmArgumentList *)arg;
  arg_local = (iterator *)reducible;
  reducible_local._7_1_ = value;
  pcStack_10 = this;
  if (value) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"1",&local_81);
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_60,&local_80,true);
    pcVar1 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                       ((_List_iterator<cmExpandedCommandArgument> *)newArgs_local);
    cmExpandedCommandArgument::operator=(pcVar1,&local_60);
    cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"0",&local_e1);
    cmExpandedCommandArgument::cmExpandedCommandArgument(&local_c0,&local_e0,true);
    pcVar1 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                       ((_List_iterator<cmExpandedCommandArgument> *)newArgs_local);
    cmExpandedCommandArgument::operator=(pcVar1,&local_c0);
    cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  this_00 = argP1_local;
  std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator(&local_f0,local_38);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)this_00,
             local_f0);
  local_38->_M_node =
       (newArgs_local->
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl._M_node.super__List_node_base._M_next;
  IncrementArguments(this,(cmArgumentList *)argP1_local,local_38,argP2);
  *(undefined4 *)&arg_local->_M_node = 1;
  return;
}

Assistant:

void cmConditionEvaluator::HandlePredicate(
  bool value, int& reducible, cmArgumentList::iterator& arg,
  cmArgumentList& newArgs, cmArgumentList::iterator& argP1,
  cmArgumentList::iterator& argP2) const
{
  if (value) {
    *arg = cmExpandedCommandArgument("1", true);
  } else {
    *arg = cmExpandedCommandArgument("0", true);
  }
  newArgs.erase(argP1);
  argP1 = arg;
  this->IncrementArguments(newArgs, argP1, argP2);
  reducible = 1;
}